

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_instance_array.cpp
# Opt level: O3

BBox3fa * embree::anon_unknown_117::boundSegmentNonlinear
                    (BBox3fa *__return_storage_ptr__,MotionDerivativeCoefficients *motionDerivCoeffs
                    ,AffineSpace3fa *xfm0,AffineSpace3fa *xfm1,BBox3fa *obbox0,BBox3fa *obbox1,
                    BBox3fa *bbox0,BBox3fa *bbox1,float tmin,float tmax)

{
  uint uVar1;
  BBox3fa *pBVar2;
  int dim;
  long lVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar14;
  float fVar15;
  float fVar16;
  float fVar21;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  uint numRoots;
  Interval1f interval;
  BBox3fa bt;
  Vec3fa p1;
  Vec3fa p0;
  MotionDerivative motionDerivative;
  float roots [32];
  float local_2b8 [6];
  BBox3fa *local_2a0;
  undefined1 local_298 [12];
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  ulong local_260;
  uint local_254;
  uint local_250;
  uint local_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  Interval1f local_1a0;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  float local_188 [4];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_128;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_118;
  BBox3fa *local_108;
  BBox3fa *local_100;
  ulong local_f8;
  ulong local_f0;
  MotionDerivativeCoefficients *local_e8;
  MotionDerivative local_dc;
  float local_b8 [34];
  
  (__return_storage_ptr__->upper).field_0.m128[0] = 0.0;
  (__return_storage_ptr__->upper).field_0.m128[1] = 0.0;
  (__return_storage_ptr__->upper).field_0.m128[2] = 0.0;
  (__return_storage_ptr__->upper).field_0.m128[3] = 0.0;
  (__return_storage_ptr__->lower).field_0.m128[0] = 0.0;
  (__return_storage_ptr__->lower).field_0.m128[1] = 0.0;
  (__return_storage_ptr__->lower).field_0.m128[2] = 0.0;
  (__return_storage_ptr__->lower).field_0.m128[3] = 0.0;
  pBVar2 = (BBox3fa *)CONCAT71((int7)((ulong)&local_1a0 >> 8),1);
  local_2a0 = __return_storage_ptr__;
  local_1a0.lower = tmin;
  local_1a0.upper = tmax;
  local_108 = obbox0;
  local_100 = obbox1;
  local_e8 = motionDerivCoeffs;
  do {
    local_254 = (uint)pBVar2;
    local_f8 = (ulong)(((byte)~(byte)pBVar2 & 1) << 4);
    pBVar2 = (BBox3fa *)0x1;
    do {
      local_250 = (uint)pBVar2;
      local_f0 = (ulong)(((byte)~(byte)pBVar2 & 1) << 4) | 4;
      pBVar2 = (BBox3fa *)0x1;
      do {
        local_24c = (uint)pBVar2;
        uVar4 = (ulong)(((byte)~(byte)pBVar2 & 1) << 4);
        local_118.m128[1] = (float)*(undefined4 *)((long)&(local_108->lower).field_0 + local_f0);
        local_118.m128[0] = (float)*(undefined4 *)((long)&(local_108->lower).field_0 + local_f8);
        local_118.m128[2] = (float)*(undefined4 *)((long)&(local_108->lower).field_0 + uVar4 + 8);
        local_118.m128[3] = 0.0;
        local_128.m128[1] = (float)*(undefined4 *)((long)&(local_100->lower).field_0 + local_f0);
        local_128.m128[0] = (float)*(undefined4 *)((long)&(local_100->lower).field_0 + local_f8);
        local_128.m128[2] = (float)*(undefined4 *)((long)&(local_100->lower).field_0 + uVar4 + 8);
        local_128.m128[3] = 0.0;
        lVar3 = 0;
        do {
          MotionDerivative::MotionDerivative
                    (&local_dc,local_e8,(int)lVar3,(Vec3fa *)&local_118.field_1,
                     (Vec3fa *)&local_128.field_1);
          fStack_190 = (bbox0->lower).field_0.m128[lVar3] - (bbox1->lower).field_0.m128[lVar3];
          local_2b8[0] = 0.0;
          local_198 = (undefined1  [8])&local_dc;
          MotionDerivative::
          findRoots<embree::MotionDerivative::EvalMotionDerivative<embree::Interval<float>>>
                    ((EvalMotionDerivative<embree::Interval<float>_> *)local_198,&local_1a0,
                     (uint *)local_2b8,local_b8,0x20);
          local_260 = (ulong)(uint)local_2b8[0];
          if (local_260 != 0) {
            fVar10 = (local_2a0->lower).field_0.m128[lVar3];
            uVar4 = 0;
            do {
              local_278 = local_b8[uVar4];
              local_1f8 = ZEXT416((uint)local_278);
              local_218 = 1.0 - local_278;
              local_228 = ZEXT416((uint)local_218);
              fStack_190 = (bbox0->lower).field_0.m128[2] * local_218 +
                           (bbox1->lower).field_0.m128[2] * local_278;
              fStack_18c = (bbox0->lower).field_0.m128[3] * local_218 +
                           (bbox1->lower).field_0.m128[3] * local_278;
              local_188[0] = (bbox0->upper).field_0.m128[0] * local_218 +
                             (bbox1->upper).field_0.m128[0] * local_278;
              local_188[1] = (bbox0->upper).field_0.m128[1] * local_218 +
                             (bbox1->upper).field_0.m128[1] * local_278;
              local_188[2] = (bbox0->upper).field_0.m128[2] * local_218 +
                             (bbox1->upper).field_0.m128[2] * local_278;
              local_188[3] = (bbox0->upper).field_0.m128[3] * local_218 +
                             (bbox1->upper).field_0.m128[3] * local_278;
              local_198._4_4_ =
                   (bbox0->lower).field_0.m128[1] * local_218 +
                   (bbox1->lower).field_0.m128[1] * local_278;
              local_198._0_4_ =
                   (bbox0->lower).field_0.m128[0] * local_218 +
                   (bbox1->lower).field_0.m128[0] * local_278;
              local_288 = (xfm0->l).vx.field_0.m128[0];
              fStack_284 = (xfm0->l).vx.field_0.m128[1];
              fStack_280 = (xfm0->l).vx.field_0.m128[2];
              fStack_27c = (xfm0->l).vx.field_0.m128[3];
              local_1c8 = (xfm0->l).vy.field_0.m128[0];
              fStack_1c4 = (xfm0->l).vy.field_0.m128[1];
              fStack_1c0 = (xfm0->l).vy.field_0.m128[2];
              fStack_1bc = (xfm0->l).vy.field_0.m128[3];
              local_138 = (xfm0->l).vz.field_0.m128[0];
              fStack_134 = (xfm0->l).vz.field_0.m128[1];
              fStack_130 = (xfm0->l).vz.field_0.m128[2];
              fVar26 = (xfm0->l).vz.field_0.m128[3];
              local_1b8 = (xfm0->p).field_0.m128[0];
              fStack_1b4 = (xfm0->p).field_0.m128[1];
              fStack_1b0 = (xfm0->p).field_0.m128[2];
              fStack_1ac = (xfm0->p).field_0.m128[3];
              local_148 = (xfm1->l).vx.field_0.m128[0];
              fStack_144 = (xfm1->l).vx.field_0.m128[1];
              fStack_140 = (xfm1->l).vx.field_0.m128[2];
              fStack_13c = (xfm1->l).vx.field_0.m128[3];
              local_1e8 = (xfm1->l).vy.field_0.m128[0];
              fStack_1e4 = (xfm1->l).vy.field_0.m128[1];
              fStack_1e0 = (xfm1->l).vy.field_0.m128[2];
              fStack_1dc = (xfm1->l).vy.field_0.m128[3];
              local_1d8 = (xfm1->p).field_0.m128[0];
              fStack_1d4 = (xfm1->p).field_0.m128[1];
              fStack_1d0 = (xfm1->p).field_0.m128[2];
              fStack_1cc = (xfm1->p).field_0.m128[3];
              local_158 = (xfm1->l).vz.field_0.m128[0];
              fStack_154 = (xfm1->l).vz.field_0.m128[1];
              fStack_150 = (xfm1->l).vz.field_0.m128[2];
              local_168 = (xfm1->l).vz.field_0.m128[3];
              fVar7 = fVar26 * local_168 +
                      fStack_1dc * fStack_1bc + fStack_1cc * fStack_1ac + fStack_27c * fStack_13c;
              local_178 = -fVar7;
              fStack_204 = -fVar26;
              fStack_200 = -fVar26;
              fStack_1fc = -fVar26;
              local_208 = fVar7;
              local_248 = fStack_13c;
              if (fVar7 < local_178) {
                local_248 = -fStack_13c;
                local_208 = local_178;
              }
              local_298._0_4_ = ABS(fVar7);
              fVar11 = (((((float)local_298._0_4_ * -0.0043095737 + 0.0192803) *
                          (float)local_298._0_4_ + -0.04489909) * (float)local_298._0_4_ +
                        0.08785567) * (float)local_298._0_4_ + -0.21450998) * (float)local_298._0_4_
              ;
              fVar5 = 1.0 - (float)local_298._0_4_;
              fStack_274 = local_278;
              fStack_270 = local_278;
              fStack_26c = local_278;
              fStack_244 = local_248;
              fStack_240 = local_248;
              fStack_23c = local_248;
              local_238 = fStack_27c;
              fStack_234 = fStack_27c;
              fStack_230 = fStack_27c;
              fStack_22c = fStack_27c;
              fStack_214 = local_218;
              fStack_210 = local_218;
              fStack_20c = local_218;
              fStack_174 = fStack_204;
              fStack_170 = fStack_200;
              fStack_16c = fStack_1fc;
              fStack_164 = local_168;
              fStack_160 = local_168;
              fStack_15c = local_168;
              fStack_14c = local_168;
              fStack_12c = fVar26;
              if (fVar5 < 0.0) {
                local_298._0_8_ = CONCAT44(fVar26,local_298._0_4_) & 0x7fffffffffffffff;
                local_298._8_4_ = ABS(fVar26);
                fStack_28c = ABS(fVar26);
                fVar5 = sqrtf(fVar5);
              }
              else {
                fVar5 = SQRT(fVar5);
              }
              fVar11 = 1.5707964 - fVar5 * (fVar11 + 1.5707952);
              fVar5 = 0.0;
              if (0.0 <= fVar11) {
                fVar5 = fVar11;
              }
              fVar5 = (float)(-(uint)(1.0 < (float)local_298._0_4_) & 0x7fc00000 |
                             ~-(uint)(1.0 < (float)local_298._0_4_) &
                             (uint)(1.5707964 -
                                   (float)((uint)-fVar5 & -(uint)(local_208 < 0.0) |
                                          ~-(uint)(local_208 < 0.0) & (uint)fVar5))) *
                      (float)local_1f8._0_4_;
              _local_298 = ZEXT416((uint)fVar5);
              fVar6 = floorf(fVar5 * 0.63661975);
              fVar8 = (float)local_298._0_4_ - fVar6 * 1.5707964;
              fVar5 = fVar8 * fVar8;
              fVar11 = ((((fVar5 * -2.5963018e-07 + 2.4756235e-05) * fVar5 + -0.001388833) * fVar5 +
                        0.04166664) * fVar5 + -0.5) * fVar5 + 1.0;
              fVar8 = (((((fVar5 * -2.5029328e-08 + 2.7600126e-06) * fVar5 + -0.00019842605) * fVar5
                        + 0.008333348) * fVar5 + -0.16666667) * fVar5 + 1.0) * fVar8;
              fVar5 = fVar8;
              if (((int)fVar6 & 1U) != 0) {
                fVar5 = fVar11;
                fVar11 = fVar8;
              }
              uVar1 = (int)fVar6 & 3;
              if (uVar1 - 1 < 2) {
                fVar11 = -fVar11;
              }
              fVar22 = (float)(~-(uint)(fVar7 < local_178) & (uint)local_168 |
                              (uint)-local_168 & -(uint)(fVar7 < local_178));
              fVar8 = local_208 * local_238 - local_248;
              fVar6 = local_208 * fVar26 - fVar22;
              if (uVar1 < 2) {
                fVar5 = -fVar5;
              }
              fVar9 = (float)local_228._0_4_ * local_238 + local_248 * (float)local_1f8._0_4_;
              fVar22 = (float)local_228._0_4_ * fVar26 + fVar22 * (float)local_1f8._0_4_;
              uVar1 = (int)((uint)(fVar7 < 0.0) << 0x1f) >> 0x1f;
              uVar14 = (int)((uint)(fVar7 < 0.0) << 0x1f) >> 0x1f;
              fVar16 = (float)((uint)-fStack_1cc & uVar1 | ~uVar1 & (uint)fStack_1cc);
              fVar21 = (float)((uint)-fStack_1dc & uVar14 | ~uVar14 & (uint)fStack_1dc);
              fVar31 = local_208 * fStack_1b4 - fVar16;
              fVar32 = local_208 * fStack_1bc - fVar21;
              auVar17._4_4_ = fStack_204;
              auVar17._0_4_ = fVar6;
              auVar17._8_4_ = fStack_200;
              auVar17._12_4_ = fStack_1fc;
              auVar18._4_12_ = auVar17._4_12_;
              auVar18._0_4_ = fVar6 * fVar6 + fVar32 * fVar32 + fVar31 * fVar31 + fVar8 * fVar8;
              auVar12._4_4_ = fStack_204;
              auVar12._0_4_ = auVar18._0_4_;
              auVar12._8_4_ = fStack_200;
              auVar12._12_4_ = fStack_1fc;
              auVar12 = rsqrtss(auVar12,auVar18);
              fVar7 = auVar12._0_4_;
              fVar7 = fVar7 * fVar7 * auVar18._0_4_ * -0.5 * fVar7 + fVar7 * 1.5;
              fVar16 = local_218 * fStack_1b4 + fVar16 * local_278;
              fVar21 = fStack_214 * fStack_1bc + fVar21 * fStack_274;
              auVar27._4_4_ = local_228._4_4_;
              auVar27._0_4_ = fVar22;
              auVar27._8_4_ = local_228._8_4_;
              auVar27._12_4_ = local_228._12_4_;
              auVar28._4_12_ = auVar27._4_12_;
              auVar28._0_4_ = fVar22 * fVar22 + fVar21 * fVar21 + fVar16 * fVar16 + fVar9 * fVar9;
              auVar24._4_4_ = local_228._4_4_;
              auVar24._0_4_ = auVar28._0_4_;
              auVar24._8_4_ = local_228._8_4_;
              auVar24._12_4_ = local_228._12_4_;
              auVar12 = rsqrtss(auVar24,auVar28);
              fVar23 = auVar12._0_4_;
              fVar23 = fVar23 * fVar23 * auVar28._0_4_ * -0.5 * fVar23 + fVar23 * 1.5;
              if (0.9995 < local_208) {
                fVar9 = fVar9 * fVar23;
              }
              else {
                fVar9 = local_238 * fVar11 + fVar8 * fVar7 * fVar5;
              }
              uVar1 = (int)((uint)(0.9995 < local_208) << 0x1f) >> 0x1f;
              uVar14 = (int)((uint)(0.9995 < local_208) << 0x1f) >> 0x1f;
              fVar8 = (float)(~uVar1 & (uint)(fVar11 * fStack_1b4 + fVar5 * fVar31 * fVar7) |
                             (uint)(fVar16 * fVar23) & uVar1);
              fVar16 = (float)(~uVar14 & (uint)(fVar11 * fStack_1bc + fVar5 * fVar32 * fVar7) |
                              (uint)(fVar21 * fVar23) & uVar14);
              if (0.9995 < local_208) {
                fVar22 = fVar22 * fVar23;
              }
              else {
                fVar22 = fVar11 * fVar26 + fVar6 * fVar7 * fVar5;
              }
              local_288 = local_288 * local_218 + local_148 * local_278;
              fStack_284 = fStack_284 * fStack_214 + fStack_144 * fStack_274;
              fStack_280 = fStack_280 * fStack_210 + fStack_140 * fStack_270;
              fStack_27c = fStack_27c * fStack_20c + fStack_13c * fStack_26c;
              fVar40 = local_1c8 * local_218 + local_1e8 * local_278;
              fVar41 = fStack_1c4 * fStack_214 + fStack_1e4 * fStack_274;
              fVar37 = local_138 * local_218 + local_158 * local_278;
              fVar38 = fStack_134 * fStack_214 + fStack_154 * fStack_274;
              fVar39 = fStack_130 * fStack_210 + fStack_150 * fStack_270;
              fVar34 = local_1b8 * local_218 + local_1d8 * local_278;
              fVar35 = fStack_1b4 * fStack_214 + fStack_1d4 * fStack_274;
              fVar36 = fStack_1b0 * fStack_210 + fStack_1d0 * fStack_270;
              fVar6 = fVar9 * fVar16 + fVar8 * fVar22;
              fVar5 = fVar9 * fVar16 - fVar8 * fVar22;
              fVar26 = fVar8 * fVar8 - fVar9 * fVar9;
              fVar11 = fVar8 * fVar8 + fVar9 * fVar9 + -fVar16 * fVar16 + -fVar22 * fVar22;
              fVar32 = fVar16 * fVar16 + fVar26 + -fVar22 * fVar22;
              fVar21 = fVar9 * fVar22 - fVar8 * fVar16;
              fVar31 = fVar8 * fVar16 + fVar9 * fVar22;
              fVar7 = fVar16 * fVar22 + fVar8 * fVar9;
              fVar23 = fVar16 * fVar22 - fVar8 * fVar9;
              fVar26 = fVar22 * fVar22 + fVar26 + -fVar16 * fVar16;
              fVar6 = fVar6 + fVar6;
              fVar21 = fVar21 + fVar21;
              fVar5 = fVar5 + fVar5;
              fVar7 = fVar7 + fVar7;
              fVar31 = fVar31 + fVar31;
              fVar23 = fVar23 + fVar23;
              fVar22 = fVar11 * 1.0 + fVar6 * 0.0 + fVar21 * 0.0;
              fVar9 = fVar11 * 0.0 + fVar6 * 1.0 + fVar21 * 0.0;
              fVar16 = fVar11 * 0.0 + fVar6 * 0.0 + fVar21 * 1.0;
              fVar21 = fVar11 * 0.0 + fVar6 * 0.0 + fVar21 * 0.0;
              fVar11 = fVar5 * 1.0 + fVar32 * 0.0 + fVar7 * 0.0;
              fVar6 = fVar5 * 0.0 + fVar32 * 1.0 + fVar7 * 0.0;
              fVar8 = fVar5 * 0.0 + fVar32 * 0.0 + fVar7 * 1.0;
              fVar7 = fVar5 * 0.0 + fVar32 * 0.0 + fVar7 * 0.0;
              fVar5 = fVar31 * 1.0 + fVar23 * 0.0 + fVar26 * 0.0;
              fVar32 = fVar31 * 0.0 + fVar23 * 1.0 + fVar26 * 0.0;
              fVar15 = fVar31 * 0.0 + fVar23 * 0.0 + fVar26 * 1.0;
              fVar26 = fVar31 * 0.0 + fVar23 * 0.0 + fVar26 * 0.0;
              fVar23 = local_218 * local_118.m128[0] + local_278 * local_128.m128[0];
              fVar31 = fStack_214 * local_118.m128[1] + fStack_274 * local_128.m128[1];
              fVar33 = fStack_210 * local_118.m128[2] + fStack_270 * local_128.m128[2];
              local_2b8[3] = fVar33 * (fVar37 * fVar21 + fVar38 * fVar7 + fVar39 * fVar26) +
                             fVar34 * fVar21 + fVar35 * fVar7 + fVar36 * fVar26 + 0.0 +
                             fVar31 * (fVar40 * fVar21 + fVar41 * fVar7 + fVar26 * 0.0) +
                             fVar23 * (local_288 * fVar21 + fVar7 * 0.0 + fVar26 * 0.0);
              local_2b8[0] = fVar33 * (fVar37 * fVar22 + fVar38 * fVar11 + fVar39 * fVar5) +
                             fVar34 * fVar22 + fVar35 * fVar11 + fVar36 * fVar5 + fStack_284 + 0.0 +
                             fVar31 * (fVar40 * fVar22 + fVar41 * fVar11 + fVar5 * 0.0) +
                             fVar23 * (local_288 * fVar22 + fVar11 * 0.0 + fVar5 * 0.0);
              local_2b8[1] = fVar33 * (fVar37 * fVar9 + fVar38 * fVar6 + fVar39 * fVar32) +
                             fVar34 * fVar9 + fVar35 * fVar6 + fVar36 * fVar32 + fStack_280 + 0.0 +
                             fVar31 * (fVar40 * fVar9 + fVar41 * fVar6 + fVar32 * 0.0) +
                             fVar23 * (local_288 * fVar9 + fVar6 * 0.0 + fVar32 * 0.0);
              local_2b8[2] = fVar33 * (fVar37 * fVar16 + fVar38 * fVar8 + fVar39 * fVar15) +
                             fVar34 * fVar16 + fVar35 * fVar8 + fVar36 * fVar15 +
                             fStack_1c0 * fStack_210 + fStack_1e0 * fStack_270 + 0.0 +
                             fVar31 * (fVar40 * fVar16 + fVar41 * fVar8 + fVar15 * 0.0) +
                             fVar23 * (local_288 * fVar16 + fVar8 * 0.0 + fVar15 * 0.0);
              fVar26 = local_2b8[lVar3] - *(float *)(local_198 + lVar3 * 4);
              if (fVar10 <= local_2b8[lVar3] - *(float *)(local_198 + lVar3 * 4)) {
                fVar26 = fVar10;
              }
              fVar10 = fVar26;
              uVar4 = uVar4 + 1;
            } while (local_260 != uVar4);
            (local_2a0->lower).field_0.m128[lVar3] = fVar10;
          }
          fStack_190 = (bbox0->upper).field_0.m128[lVar3] - (bbox1->upper).field_0.m128[lVar3];
          local_2b8[0] = 0.0;
          local_198 = (undefined1  [8])&local_dc;
          MotionDerivative::
          findRoots<embree::MotionDerivative::EvalMotionDerivative<embree::Interval<float>>>
                    ((EvalMotionDerivative<embree::Interval<float>_> *)local_198,&local_1a0,
                     (uint *)local_2b8,local_b8,0x20);
          local_260 = (ulong)(uint)local_2b8[0];
          if (local_260 != 0) {
            fVar10 = (local_2a0->upper).field_0.m128[lVar3];
            uVar4 = 0;
            do {
              local_278 = local_b8[uVar4];
              local_1f8 = ZEXT416((uint)local_278);
              local_218 = 1.0 - local_278;
              local_228 = ZEXT416((uint)local_218);
              local_188[0] = (bbox0->upper).field_0.m128[0] * local_218 +
                             (bbox1->upper).field_0.m128[0] * local_278;
              local_188[1] = (bbox0->upper).field_0.m128[1] * local_218 +
                             (bbox1->upper).field_0.m128[1] * local_278;
              local_188[2] = (bbox0->upper).field_0.m128[2] * local_218 +
                             (bbox1->upper).field_0.m128[2] * local_278;
              local_188[3] = (bbox0->upper).field_0.m128[3] * local_218 +
                             (bbox1->upper).field_0.m128[3] * local_278;
              local_288 = (xfm0->l).vx.field_0.m128[0];
              fStack_284 = (xfm0->l).vx.field_0.m128[1];
              fStack_280 = (xfm0->l).vx.field_0.m128[2];
              fStack_27c = (xfm0->l).vx.field_0.m128[3];
              local_1c8 = (xfm0->l).vy.field_0.m128[0];
              fStack_1c4 = (xfm0->l).vy.field_0.m128[1];
              fStack_1c0 = (xfm0->l).vy.field_0.m128[2];
              fStack_1bc = (xfm0->l).vy.field_0.m128[3];
              local_138 = (xfm0->l).vz.field_0.m128[0];
              fStack_134 = (xfm0->l).vz.field_0.m128[1];
              fStack_130 = (xfm0->l).vz.field_0.m128[2];
              fVar26 = (xfm0->l).vz.field_0.m128[3];
              local_1b8 = (xfm0->p).field_0.m128[0];
              fStack_1b4 = (xfm0->p).field_0.m128[1];
              fStack_1b0 = (xfm0->p).field_0.m128[2];
              fStack_1ac = (xfm0->p).field_0.m128[3];
              local_148 = (xfm1->l).vx.field_0.m128[0];
              fStack_144 = (xfm1->l).vx.field_0.m128[1];
              fStack_140 = (xfm1->l).vx.field_0.m128[2];
              fStack_13c = (xfm1->l).vx.field_0.m128[3];
              local_1e8 = (xfm1->l).vy.field_0.m128[0];
              fStack_1e4 = (xfm1->l).vy.field_0.m128[1];
              fStack_1e0 = (xfm1->l).vy.field_0.m128[2];
              fStack_1dc = (xfm1->l).vy.field_0.m128[3];
              local_1d8 = (xfm1->p).field_0.m128[0];
              fStack_1d4 = (xfm1->p).field_0.m128[1];
              fStack_1d0 = (xfm1->p).field_0.m128[2];
              fStack_1cc = (xfm1->p).field_0.m128[3];
              local_158 = (xfm1->l).vz.field_0.m128[0];
              fStack_154 = (xfm1->l).vz.field_0.m128[1];
              fStack_150 = (xfm1->l).vz.field_0.m128[2];
              local_168 = (xfm1->l).vz.field_0.m128[3];
              fVar7 = fVar26 * local_168 +
                      fStack_1dc * fStack_1bc + fStack_1cc * fStack_1ac + fStack_27c * fStack_13c;
              local_178 = -fVar7;
              fStack_204 = -fVar26;
              fStack_200 = -fVar26;
              fStack_1fc = -fVar26;
              local_208 = fVar7;
              local_248 = fStack_13c;
              if (fVar7 < local_178) {
                local_248 = -fStack_13c;
                local_208 = local_178;
              }
              local_298._0_4_ = ABS(fVar7);
              fVar11 = (((((float)local_298._0_4_ * -0.0043095737 + 0.0192803) *
                          (float)local_298._0_4_ + -0.04489909) * (float)local_298._0_4_ +
                        0.08785567) * (float)local_298._0_4_ + -0.21450998) * (float)local_298._0_4_
              ;
              fVar5 = 1.0 - (float)local_298._0_4_;
              fStack_274 = local_278;
              fStack_270 = local_278;
              fStack_26c = local_278;
              fStack_244 = local_248;
              fStack_240 = local_248;
              fStack_23c = local_248;
              local_238 = fStack_27c;
              fStack_234 = fStack_27c;
              fStack_230 = fStack_27c;
              fStack_22c = fStack_27c;
              fStack_214 = local_218;
              fStack_210 = local_218;
              fStack_20c = local_218;
              fStack_174 = fStack_204;
              fStack_170 = fStack_200;
              fStack_16c = fStack_1fc;
              fStack_164 = local_168;
              fStack_160 = local_168;
              fStack_15c = local_168;
              fStack_14c = local_168;
              fStack_12c = fVar26;
              if (fVar5 < 0.0) {
                local_298._0_8_ = CONCAT44(fVar26,local_298._0_4_) & 0x7fffffffffffffff;
                local_298._8_4_ = ABS(fVar26);
                fStack_28c = ABS(fVar26);
                fVar5 = sqrtf(fVar5);
              }
              else {
                fVar5 = SQRT(fVar5);
              }
              fVar11 = 1.5707964 - fVar5 * (fVar11 + 1.5707952);
              fVar5 = 0.0;
              if (0.0 <= fVar11) {
                fVar5 = fVar11;
              }
              fVar5 = (float)(-(uint)(1.0 < (float)local_298._0_4_) & 0x7fc00000 |
                             ~-(uint)(1.0 < (float)local_298._0_4_) &
                             (uint)(1.5707964 -
                                   (float)((uint)-fVar5 & -(uint)(local_208 < 0.0) |
                                          ~-(uint)(local_208 < 0.0) & (uint)fVar5))) *
                      (float)local_1f8._0_4_;
              _local_298 = ZEXT416((uint)fVar5);
              fVar6 = floorf(fVar5 * 0.63661975);
              fVar8 = (float)local_298._0_4_ - fVar6 * 1.5707964;
              fVar5 = fVar8 * fVar8;
              fVar11 = ((((fVar5 * -2.5963018e-07 + 2.4756235e-05) * fVar5 + -0.001388833) * fVar5 +
                        0.04166664) * fVar5 + -0.5) * fVar5 + 1.0;
              fVar8 = (((((fVar5 * -2.5029328e-08 + 2.7600126e-06) * fVar5 + -0.00019842605) * fVar5
                        + 0.008333348) * fVar5 + -0.16666667) * fVar5 + 1.0) * fVar8;
              fVar5 = fVar8;
              if (((int)fVar6 & 1U) != 0) {
                fVar5 = fVar11;
                fVar11 = fVar8;
              }
              uVar1 = (int)fVar6 & 3;
              if (uVar1 - 1 < 2) {
                fVar11 = -fVar11;
              }
              fVar22 = (float)(~-(uint)(fVar7 < local_178) & (uint)local_168 |
                              (uint)-local_168 & -(uint)(fVar7 < local_178));
              fVar8 = local_208 * local_238 - local_248;
              fVar6 = local_208 * fVar26 - fVar22;
              if (uVar1 < 2) {
                fVar5 = -fVar5;
              }
              fVar9 = (float)local_228._0_4_ * local_238 + local_248 * (float)local_1f8._0_4_;
              fVar22 = (float)local_228._0_4_ * fVar26 + fVar22 * (float)local_1f8._0_4_;
              uVar1 = (int)((uint)(fVar7 < 0.0) << 0x1f) >> 0x1f;
              uVar14 = (int)((uint)(fVar7 < 0.0) << 0x1f) >> 0x1f;
              fVar16 = (float)((uint)-fStack_1cc & uVar1 | ~uVar1 & (uint)fStack_1cc);
              fVar21 = (float)((uint)-fStack_1dc & uVar14 | ~uVar14 & (uint)fStack_1dc);
              fVar31 = local_208 * fStack_1b4 - fVar16;
              fVar32 = local_208 * fStack_1bc - fVar21;
              auVar19._4_4_ = fStack_204;
              auVar19._0_4_ = fVar6;
              auVar19._8_4_ = fStack_200;
              auVar19._12_4_ = fStack_1fc;
              auVar20._4_12_ = auVar19._4_12_;
              auVar20._0_4_ = fVar6 * fVar6 + fVar32 * fVar32 + fVar31 * fVar31 + fVar8 * fVar8;
              auVar13._4_4_ = fStack_204;
              auVar13._0_4_ = auVar20._0_4_;
              auVar13._8_4_ = fStack_200;
              auVar13._12_4_ = fStack_1fc;
              auVar12 = rsqrtss(auVar13,auVar20);
              fVar7 = auVar12._0_4_;
              fVar7 = fVar7 * fVar7 * auVar20._0_4_ * -0.5 * fVar7 + fVar7 * 1.5;
              fVar16 = local_218 * fStack_1b4 + fVar16 * local_278;
              fVar21 = fStack_214 * fStack_1bc + fVar21 * fStack_274;
              auVar29._4_4_ = local_228._4_4_;
              auVar29._0_4_ = fVar22;
              auVar29._8_4_ = local_228._8_4_;
              auVar29._12_4_ = local_228._12_4_;
              auVar30._4_12_ = auVar29._4_12_;
              auVar30._0_4_ = fVar22 * fVar22 + fVar21 * fVar21 + fVar16 * fVar16 + fVar9 * fVar9;
              auVar25._4_4_ = local_228._4_4_;
              auVar25._0_4_ = auVar30._0_4_;
              auVar25._8_4_ = local_228._8_4_;
              auVar25._12_4_ = local_228._12_4_;
              auVar12 = rsqrtss(auVar25,auVar30);
              fVar23 = auVar12._0_4_;
              fVar23 = fVar23 * fVar23 * auVar30._0_4_ * -0.5 * fVar23 + fVar23 * 1.5;
              if (0.9995 < local_208) {
                fVar9 = fVar9 * fVar23;
              }
              else {
                fVar9 = local_238 * fVar11 + fVar8 * fVar7 * fVar5;
              }
              uVar1 = (int)((uint)(0.9995 < local_208) << 0x1f) >> 0x1f;
              uVar14 = (int)((uint)(0.9995 < local_208) << 0x1f) >> 0x1f;
              fVar8 = (float)(~uVar1 & (uint)(fVar11 * fStack_1b4 + fVar5 * fVar31 * fVar7) |
                             (uint)(fVar16 * fVar23) & uVar1);
              fVar16 = (float)(~uVar14 & (uint)(fVar11 * fStack_1bc + fVar5 * fVar32 * fVar7) |
                              (uint)(fVar21 * fVar23) & uVar14);
              if (0.9995 < local_208) {
                fVar22 = fVar22 * fVar23;
              }
              else {
                fVar22 = fVar11 * fVar26 + fVar6 * fVar7 * fVar5;
              }
              local_288 = local_288 * local_218 + local_148 * local_278;
              fStack_284 = fStack_284 * fStack_214 + fStack_144 * fStack_274;
              fStack_280 = fStack_280 * fStack_210 + fStack_140 * fStack_270;
              fStack_27c = fStack_27c * fStack_20c + fStack_13c * fStack_26c;
              fVar34 = local_1c8 * local_218 + local_1e8 * local_278;
              fVar35 = fStack_1c4 * fStack_214 + fStack_1e4 * fStack_274;
              fVar36 = local_138 * local_218 + local_158 * local_278;
              fVar37 = fStack_134 * fStack_214 + fStack_154 * fStack_274;
              fVar38 = fStack_130 * fStack_210 + fStack_150 * fStack_270;
              fVar39 = local_1b8 * local_218 + local_1d8 * local_278;
              fVar40 = fStack_1b4 * fStack_214 + fStack_1d4 * fStack_274;
              fVar41 = fStack_1b0 * fStack_210 + fStack_1d0 * fStack_270;
              fVar6 = fVar9 * fVar16 + fVar8 * fVar22;
              fVar5 = fVar9 * fVar16 - fVar8 * fVar22;
              fVar26 = fVar8 * fVar8 - fVar9 * fVar9;
              fVar11 = fVar8 * fVar8 + fVar9 * fVar9 + -fVar16 * fVar16 + -fVar22 * fVar22;
              fVar32 = fVar16 * fVar16 + fVar26 + -fVar22 * fVar22;
              fVar21 = fVar9 * fVar22 - fVar8 * fVar16;
              fVar31 = fVar8 * fVar16 + fVar9 * fVar22;
              fVar7 = fVar16 * fVar22 + fVar8 * fVar9;
              fVar23 = fVar16 * fVar22 - fVar8 * fVar9;
              fVar26 = fVar22 * fVar22 + fVar26 + -fVar16 * fVar16;
              fVar6 = fVar6 + fVar6;
              fVar21 = fVar21 + fVar21;
              fVar5 = fVar5 + fVar5;
              fVar7 = fVar7 + fVar7;
              fVar31 = fVar31 + fVar31;
              fVar23 = fVar23 + fVar23;
              fVar22 = fVar11 * 1.0 + fVar6 * 0.0 + fVar21 * 0.0;
              fVar9 = fVar11 * 0.0 + fVar6 * 1.0 + fVar21 * 0.0;
              fVar16 = fVar11 * 0.0 + fVar6 * 0.0 + fVar21 * 1.0;
              fVar21 = fVar11 * 0.0 + fVar6 * 0.0 + fVar21 * 0.0;
              fVar11 = fVar5 * 1.0 + fVar32 * 0.0 + fVar7 * 0.0;
              fVar6 = fVar5 * 0.0 + fVar32 * 1.0 + fVar7 * 0.0;
              fVar8 = fVar5 * 0.0 + fVar32 * 0.0 + fVar7 * 1.0;
              fVar7 = fVar5 * 0.0 + fVar32 * 0.0 + fVar7 * 0.0;
              fVar5 = fVar31 * 1.0 + fVar23 * 0.0 + fVar26 * 0.0;
              fVar32 = fVar31 * 0.0 + fVar23 * 1.0 + fVar26 * 0.0;
              fVar15 = fVar31 * 0.0 + fVar23 * 0.0 + fVar26 * 1.0;
              fVar26 = fVar31 * 0.0 + fVar23 * 0.0 + fVar26 * 0.0;
              fVar23 = local_218 * local_118.m128[0] + local_278 * local_128.m128[0];
              fVar31 = fStack_214 * local_118.m128[1] + fStack_274 * local_128.m128[1];
              fVar33 = fStack_210 * local_118.m128[2] + fStack_270 * local_128.m128[2];
              local_2b8[3] = fVar33 * (fVar36 * fVar21 + fVar37 * fVar7 + fVar38 * fVar26) +
                             fVar39 * fVar21 + fVar40 * fVar7 + fVar41 * fVar26 + 0.0 +
                             fVar31 * (fVar34 * fVar21 + fVar35 * fVar7 + fVar26 * 0.0) +
                             fVar23 * (local_288 * fVar21 + fVar7 * 0.0 + fVar26 * 0.0);
              local_2b8[0] = fVar33 * (fVar36 * fVar22 + fVar37 * fVar11 + fVar38 * fVar5) +
                             fVar39 * fVar22 + fVar40 * fVar11 + fVar41 * fVar5 + fStack_284 + 0.0 +
                             fVar31 * (fVar34 * fVar22 + fVar35 * fVar11 + fVar5 * 0.0) +
                             fVar23 * (local_288 * fVar22 + fVar11 * 0.0 + fVar5 * 0.0);
              local_2b8[1] = fVar33 * (fVar36 * fVar9 + fVar37 * fVar6 + fVar38 * fVar32) +
                             fVar39 * fVar9 + fVar40 * fVar6 + fVar41 * fVar32 + fStack_280 + 0.0 +
                             fVar31 * (fVar34 * fVar9 + fVar35 * fVar6 + fVar32 * 0.0) +
                             fVar23 * (local_288 * fVar9 + fVar6 * 0.0 + fVar32 * 0.0);
              local_2b8[2] = fVar33 * (fVar36 * fVar16 + fVar37 * fVar8 + fVar38 * fVar15) +
                             fVar39 * fVar16 + fVar40 * fVar8 + fVar41 * fVar15 +
                             fStack_1c0 * fStack_210 + fStack_1e0 * fStack_270 + 0.0 +
                             fVar31 * (fVar34 * fVar16 + fVar35 * fVar8 + fVar15 * 0.0) +
                             fVar23 * (local_288 * fVar16 + fVar8 * 0.0 + fVar15 * 0.0);
              fVar26 = local_2b8[lVar3] - local_188[lVar3];
              if (local_2b8[lVar3] - local_188[lVar3] <= fVar10) {
                fVar26 = fVar10;
              }
              fVar10 = fVar26;
              uVar4 = uVar4 + 1;
            } while (local_260 != uVar4);
            (local_2a0->upper).field_0.m128[lVar3] = fVar10;
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        pBVar2 = (BBox3fa *)0x0;
      } while ((local_24c & 1) != 0);
    } while ((local_250 & 1) != 0);
  } while ((local_254 & 1) != 0);
  return pBVar2;
}

Assistant:

BBox3fa boundSegmentNonlinear(MotionDerivativeCoefficients const& motionDerivCoeffs,
                                AffineSpace3fa const& xfm0,
                                AffineSpace3fa const& xfm1,
                                BBox3fa const& obbox0,
                                BBox3fa const& obbox1,
                                BBox3fa const& bbox0,
                                BBox3fa const& bbox1,
                                float tmin,
                                float tmax)
  {
    BBox3fa delta(Vec3fa(0.f), Vec3fa(0.f));
    float roots[32];
    unsigned int maxNumRoots = 32;
    unsigned int numRoots;
    const Interval1f interval(tmin, tmax);

    // loop over bounding box corners
    for (int ii = 0; ii < 2; ++ii)
    for (int jj = 0; jj < 2; ++jj)
    for (int kk = 0; kk < 2; ++kk)
    {
      Vec3fa p0(ii == 0 ? obbox0.lower.x : obbox0.upper.x,
                jj == 0 ? obbox0.lower.y : obbox0.upper.y,
                kk == 0 ? obbox0.lower.z : obbox0.upper.z);
      Vec3fa p1(ii == 0 ? obbox1.lower.x : obbox1.upper.x,
                jj == 0 ? obbox1.lower.y : obbox1.upper.y,
                kk == 0 ? obbox1.lower.z : obbox1.upper.z);

      // get extrema of motion of bounding box corner for each dimension
      for (int dim = 0; dim < 3; ++dim)
      {
        MotionDerivative motionDerivative(motionDerivCoeffs, dim, p0, p1);

        numRoots = motionDerivative.findRoots(interval, bbox0.lower[dim] - bbox1.lower[dim], roots, maxNumRoots);
        for (unsigned int r = 0; r < numRoots; ++r) {
          float t = roots[r];
          const BBox3fa bt = lerp(bbox0, bbox1, t);
          const Vec3fa  pt = xfmPoint(slerp(xfm0, xfm1, t), lerp(p0, p1, t));
          delta.lower[dim] = std::min(delta.lower[dim], pt[dim] - bt.lower[dim]);
        }

        numRoots = motionDerivative.findRoots(interval, bbox0.upper[dim] - bbox1.upper[dim], roots, maxNumRoots);
        for (unsigned int r = 0; r < numRoots; ++r) {
          float t = roots[r];
          const BBox3fa bt = lerp(bbox0, bbox1, t);
          const Vec3fa  pt = xfmPoint(slerp(xfm0, xfm1, t), lerp(p0, p1, t));
          delta.upper[dim] = std::max(delta.upper[dim], pt[dim] - bt.upper[dim]);
        }
      }
    }

    return delta;
  }